

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferVariableTestGroup::init
          (BufferVariableTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ContextType type;
  GLSLVersion glslVersion;
  int extraout_EAX;
  TestNode *pTVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  ResourceTestCase *pRVar7;
  int ndx;
  int iVar8;
  deInt32 *pdVar9;
  SharedPtr buffer;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr binding;
  Node *local_c8;
  SharedPtrStateBase *pSStack_c0;
  MatrixOrder local_b8;
  SharedPtr local_b0;
  Node *local_a0;
  SharedPtrStateBase *local_98;
  Node *local_90;
  SharedPtrStateBase *local_88;
  Node *local_80;
  SharedPtrStateBase *local_78;
  SharedPtr local_70;
  Node *local_60;
  SharedPtrStateBase *local_58;
  SharedPtr local_50;
  Context *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"resource_list","Resource list");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableResourceListBlockContentsProxy);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"array_size","Array size");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"array_stride","Array stride");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"block_index","Block index");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_40 = (this->super_TestCaseGroup).m_context;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->m_type = TYPE_PROGRAM;
  (pNVar3->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar3->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  local_80 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_SHADER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b2f8;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar5[1]._vptr_Node + 4) = glslVersion;
  local_90 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_88 = pSVar4;
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_a0 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_98 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  local_50.m_ptr = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_50.m_state = pSVar4;
  pNVar3 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)&local_c8,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b530;
  pNVar3[1]._vptr_Node = (_func_int **)local_c8;
  *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_c0;
  *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_b8;
  local_58 = (SharedPtrStateBase *)0x0;
  local_60 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_58 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar5[1]._vptr_Node = 1;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_c0 = pSVar4;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_b0.m_state = (SharedPtrStateBase *)0x0;
  local_b0.m_ptr = pNVar3;
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  local_b0.m_state = pSVar6;
  pRVar7 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_70,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase
            (pRVar7,local_40,&local_b0,(ProgramResourceQueryTestTarget *)&local_70,"named_block");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar7);
  pSVar4 = local_b0.m_state;
  pdVar9 = &pSVar6->strongRefCount;
  LOCK();
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if (*pdVar9 == 0) {
    local_b0.m_ptr = (Node *)0x0;
    (*(local_b0.m_state)->_vptr_SharedPtrStateBase[2])(local_b0.m_state);
  }
  LOCK();
  pdVar9 = &pSVar4->weakRefCount;
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if ((*pdVar9 == 0) && (local_b0.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_b0.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar4 = pSStack_c0;
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &pSStack_c0->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])(pSStack_c0);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_c0 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = local_60;
  (pNVar3->m_enclosingNode).m_state = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_58->strongRefCount = local_58->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_c0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_VARIABLE;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  local_b0.m_state = (SharedPtrStateBase *)0x0;
  local_b0.m_ptr = pNVar5;
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  local_b0.m_state = pSVar6;
  pRVar7 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_70,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase
            (pRVar7,local_40,&local_b0,(ProgramResourceQueryTestTarget *)&local_70,"unnamed_block");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar7);
  pSVar4 = local_b0.m_state;
  pdVar9 = &pSVar6->strongRefCount;
  LOCK();
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if (*pdVar9 == 0) {
    local_b0.m_ptr = (Node *)0x0;
    (*(local_b0.m_state)->_vptr_SharedPtrStateBase[2])(local_b0.m_state);
  }
  LOCK();
  pdVar9 = &pSVar4->weakRefCount;
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if ((*pdVar9 == 0) && (local_b0.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_b0.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar4 = pSStack_c0;
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &pSStack_c0->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])(pSStack_c0);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_c0 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = local_60;
  (pNVar3->m_enclosingNode).m_state = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_58->strongRefCount = local_58->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar9 = *pdVar9 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
  pSStack_c0 = (SharedPtrStateBase *)0x0;
  local_c8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_c0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar5[1]._vptr_Node = 1;
  local_b0.m_state = (SharedPtrStateBase *)0x0;
  local_b0.m_ptr = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_b0.m_state = pSVar4;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_70.m_state = (SharedPtrStateBase *)0x0;
  local_70.m_ptr = pNVar3;
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  local_70.m_state = pSVar6;
  pRVar7 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase(pRVar7,local_40,&local_70,&local_38,"block_array");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar7);
  pSVar4 = local_70.m_state;
  pdVar9 = &pSVar6->strongRefCount;
  LOCK();
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if (*pdVar9 == 0) {
    local_70.m_ptr = (Node *)0x0;
    (*(local_70.m_state)->_vptr_SharedPtrStateBase[2])(local_70.m_state);
  }
  LOCK();
  pdVar9 = &pSVar4->weakRefCount;
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if ((*pdVar9 == 0) && (local_70.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_70.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar4 = local_b0.m_state;
  if (local_b0.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &(local_b0.m_state)->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_b0.m_ptr = (Node *)0x0;
      (*(local_b0.m_state)->_vptr_SharedPtrStateBase[2])(local_b0.m_state);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_b0.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_b0.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = pSStack_c0;
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &pSStack_c0->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])(pSStack_c0);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_c0 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_58;
  if (local_58 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_58->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_60 = (Node *)0x0;
      (*local_58->_vptr_SharedPtrStateBase[2])(local_58);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_58 != (SharedPtrStateBase *)0x0)) {
      (*local_58->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_50.m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &(local_50.m_state)->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_50.m_ptr = (Node *)0x0;
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])(local_50.m_state);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_98;
  if (local_98 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_98->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_a0 = (Node *)0x0;
      (*local_98->_vptr_SharedPtrStateBase[2])(local_98);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_98 != (SharedPtrStateBase *)0x0)) {
      (*local_98->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_88;
  if (local_88 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_88->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_90 = (Node *)0x0;
      (*local_88->_vptr_SharedPtrStateBase[2])(local_88);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88 != (SharedPtrStateBase *)0x0)) {
      (*local_88->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_78;
  if (local_78 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_78->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_80 = (Node *)0x0;
      (*local_78->_vptr_SharedPtrStateBase[2])(local_78);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_78 != (SharedPtrStateBase *)0x0)) {
      (*local_78->_vptr_SharedPtrStateBase[1])();
    }
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"is_row_major","Is row major");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)64>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"matrix_stride","Matrix stride");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)128>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"name_length","Name length");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableNameLengthCases);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"offset","Offset");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableOffsetCases);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"referenced_by","Referenced by");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateReferencedByShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableReferencedByBlockContents);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"top_level_array_size","Top-level array size"
            );
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"top_level_array_stride",
             "Top-level array stride");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)65536>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"type","Type");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_40 = (this->super_TestCaseGroup).m_context;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->m_type = TYPE_PROGRAM;
  (pNVar3->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar3->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  local_c8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_c0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_SHADER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b2f8;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar5[1]._vptr_Node + 4) = glslVersion;
  local_80 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78 = pSVar4;
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b330;
  local_90 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_88 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  local_a0 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_98 = pSVar4;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar3->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar9 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar9 = *pdVar9 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_0216b3a0;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 1;
  local_50.m_ptr = pNVar3;
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  local_50.m_state = pSVar6;
  generateBufferVariableTypeCases(local_40,&local_50,(TestCaseGroup *)pTVar2,3);
  pSVar4 = local_50.m_state;
  pdVar9 = &pSVar6->strongRefCount;
  LOCK();
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if (*pdVar9 == 0) {
    local_50.m_ptr = (Node *)0x0;
    (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])(local_50.m_state);
  }
  LOCK();
  pdVar9 = &pSVar4->weakRefCount;
  *pdVar9 = *pdVar9 + -1;
  UNLOCK();
  if ((*pdVar9 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar4 = local_98;
  if (local_98 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_98->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_a0 = (Node *)0x0;
      (*local_98->_vptr_SharedPtrStateBase[2])(local_98);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_98 != (SharedPtrStateBase *)0x0)) {
      (*local_98->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_88;
  if (local_88 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_88->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_90 = (Node *)0x0;
      (*local_88->_vptr_SharedPtrStateBase[2])(local_88);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_88 != (SharedPtrStateBase *)0x0)) {
      (*local_88->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = local_78;
  if (local_78 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &local_78->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_80 = (Node *)0x0;
      (*local_78->_vptr_SharedPtrStateBase[2])(local_78);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (local_78 != (SharedPtrStateBase *)0x0)) {
      (*local_78->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar4 = pSStack_c0;
  if (pSStack_c0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar9 = &pSStack_c0->strongRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if (*pdVar9 == 0) {
      local_c8 = (Node *)0x0;
      (*pSStack_c0->_vptr_SharedPtrStateBase[2])(pSStack_c0);
    }
    LOCK();
    pdVar9 = &pSVar4->weakRefCount;
    *pdVar9 = *pdVar9 + -1;
    UNLOCK();
    if ((*pdVar9 == 0) && (pSStack_c0 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_c0->_vptr_SharedPtrStateBase[1])();
    }
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"random","Random");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  iVar8 = 0;
  do {
    generateBufferVariableRandomCase(pCVar1,(TestCaseGroup *)pTVar2,glslVersion,iVar8,false);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x28);
  iVar8 = 0x28;
  do {
    generateBufferVariableRandomCase(pCVar1,(TestCaseGroup *)pTVar2,glslVersion,iVar8,true);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x50);
  return extraout_EAX;
}

Assistant:

void BufferVariableTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "resource_list", "Resource list");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableResourceListBlockContentsProxy);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_size", "Array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_stride", "Array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_STRIDE>);
	}

	// .block_index
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "block_index", "Block index");
		addChild(blockGroup);
		generateBufferVariableBlockIndexCases(m_context, glslVersion, blockGroup);
	}

	// .is_row_major
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "is_row_major", "Is row major");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR>);
	}

	// .matrix_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "matrix_stride", "Matrix stride");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_STRIDE>);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "name_length", "Name length");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableNameLengthCases);
	}

	// .offset
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "offset", "Offset");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableOffsetCases);
	}

	// .referenced_by
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "referenced_by", "Referenced by");
		addChild(blockGroup);
		generateReferencedByShaderCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableReferencedByBlockContents);
	}

	// .top_level_array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_size", "Top-level array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE>);
	}

	// .top_level_array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_stride", "Top-level array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_STRIDE>);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "type", "Type");
		addChild(blockGroup);
		generateBufferVariableTypeBlock(m_context, blockGroup, glslVersion);
	}

	// .random
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "random", "Random");
		addChild(blockGroup);
		generateBufferVariableRandomCases(m_context, blockGroup, glslVersion);
	}
}